

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiContextTests.cpp
# Opt level: O2

TestCaseGroup * deqp::egl::createMultiContextTests(EglTestContext *eglTestCtx)

{
  TestCaseGroup *pTVar1;
  MultiContextTest *pMVar2;
  MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_> group;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar1,eglTestCtx,"multicontext","EGL multi context tests.");
  group.super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>.
  m_data.ptr = pTVar1;
  pMVar2 = (MultiContextTest *)operator_new(0x80);
  anon_unknown_0::MultiContextTest::MultiContextTest
            (pMVar2,eglTestCtx,SHARING_NONE,USE_NONE,"non_shared",
             "Create multiple non-shared contexts.");
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pMVar2);
  pTVar1 = group.
           super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
           .m_data.ptr;
  pMVar2 = (MultiContextTest *)operator_new(0x80);
  anon_unknown_0::MultiContextTest::MultiContextTest
            (pMVar2,eglTestCtx,SHARING_SHARED,USE_NONE,"shared","Create multiple shared contexts.");
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pMVar2);
  pTVar1 = group.
           super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
           .m_data.ptr;
  pMVar2 = (MultiContextTest *)operator_new(0x80);
  anon_unknown_0::MultiContextTest::MultiContextTest
            (pMVar2,eglTestCtx,SHARING_NONE,USE_MAKECURRENT,"non_shared_make_current",
             "Create multiple non-shared contexts.");
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pMVar2);
  pTVar1 = group.
           super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
           .m_data.ptr;
  pMVar2 = (MultiContextTest *)operator_new(0x80);
  anon_unknown_0::MultiContextTest::MultiContextTest
            (pMVar2,eglTestCtx,SHARING_SHARED,USE_MAKECURRENT,"shared_make_current",
             "Create multiple shared contexts.");
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pMVar2);
  pTVar1 = group.
           super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
           .m_data.ptr;
  pMVar2 = (MultiContextTest *)operator_new(0x80);
  anon_unknown_0::MultiContextTest::MultiContextTest
            (pMVar2,eglTestCtx,SHARING_NONE,USE_CLEAR,"non_shared_clear",
             "Create multiple non-shared contexts.");
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pMVar2);
  pTVar1 = group.
           super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
           .m_data.ptr;
  pMVar2 = (MultiContextTest *)operator_new(0x80);
  anon_unknown_0::MultiContextTest::MultiContextTest
            (pMVar2,eglTestCtx,SHARING_SHARED,USE_CLEAR,"shared_clear",
             "Create multiple shared contexts.");
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pMVar2);
  pTVar1 = group.
           super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
           .m_data.ptr;
  group.super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  de::details::UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
  ~UniqueBase(&group.
               super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
             );
  return pTVar1;
}

Assistant:

TestCaseGroup* createMultiContextTests (EglTestContext& eglTestCtx)
{
	de::MovePtr<TestCaseGroup> group (new TestCaseGroup(eglTestCtx, "multicontext", "EGL multi context tests."));

	group->addChild(new MultiContextTest(eglTestCtx, MultiContextTest::SHARING_NONE,	MultiContextTest::USE_NONE,			"non_shared",				"Create multiple non-shared contexts."));
	group->addChild(new MultiContextTest(eglTestCtx, MultiContextTest::SHARING_SHARED,	MultiContextTest::USE_NONE,			"shared",					"Create multiple shared contexts."));

	group->addChild(new MultiContextTest(eglTestCtx, MultiContextTest::SHARING_NONE,	MultiContextTest::USE_MAKECURRENT,	"non_shared_make_current",	"Create multiple non-shared contexts."));
	group->addChild(new MultiContextTest(eglTestCtx, MultiContextTest::SHARING_SHARED,	MultiContextTest::USE_MAKECURRENT,	"shared_make_current",		"Create multiple shared contexts."));

	group->addChild(new MultiContextTest(eglTestCtx, MultiContextTest::SHARING_NONE,	MultiContextTest::USE_CLEAR,		"non_shared_clear",			"Create multiple non-shared contexts."));
	group->addChild(new MultiContextTest(eglTestCtx, MultiContextTest::SHARING_SHARED,	MultiContextTest::USE_CLEAR,		"shared_clear",				"Create multiple shared contexts."));

	return group.release();
}